

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::VertexArrays::ElementBufferTest::ElementBufferTest
          (ElementBufferTest *this,Context *context)

{
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"vertex_arrays_element_buffer",
             "Vertex Array Objects Element Buffer Test");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02137690;
  this->m_po = 0;
  this->m_vao = 0;
  this->m_bo_array = 0;
  this->m_bo_elements = 0;
  this->m_bo_xfb = 0;
  return;
}

Assistant:

ElementBufferTest::ElementBufferTest(deqp::Context& context)
	: deqp::TestCase(context, "vertex_arrays_element_buffer", "Vertex Array Objects Element Buffer Test")
	, m_po(0)
	, m_vao(0)
	, m_bo_array(0)
	, m_bo_elements(0)
	, m_bo_xfb(0)
{
	/* Intentionally left blank. */
}